

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET read_image(RK_U8 *buf,FILE *fp,RK_U32 width,RK_U32 height,RK_U32 hor_stride,
                  RK_U32 ver_stride,MppFrameFormat fmt)

{
  uint uVar1;
  MppFrameFormat MVar2;
  MPP_RET MVar3;
  size_t sVar4;
  uint uVar5;
  uint local_64;
  RK_U32 header_size;
  RK_U32 align_h;
  RK_U32 align_w;
  RK_U8 *buf_v;
  RK_U8 *buf_u;
  RK_U8 *buf_y;
  RK_U32 row;
  RK_U32 read_size;
  MPP_RET ret;
  RK_U32 ver_stride_local;
  RK_U32 hor_stride_local;
  RK_U32 height_local;
  RK_U32 width_local;
  FILE *fp_local;
  RK_U8 *buf_local;
  
  row = 0;
  uVar5 = hor_stride * ver_stride;
  if ((fmt & 0xf00000) != MPP_FMT_YUV420SP) {
    uVar5 = width + 0xf & 0xfffffff0;
    uVar1 = height + 0xf & 0xfffffff0;
    if ((fmt & 0xf00000) == 0x100000) {
      local_64 = (uVar5 * uVar1 >> 4) + 0xfff & 0xfffff000;
    }
    else {
      local_64 = uVar5 * uVar1 >> 4;
    }
    sVar4 = fread(buf,1,(ulong)local_64,(FILE *)fp);
    if ((uint)sVar4 != local_64) {
      _mpp_log_l(2,"utils","read fbc file header failed %d vs %d\n","read_image",sVar4 & 0xffffffff,
                 local_64);
      return MPP_NOK;
    }
    MVar2 = fmt & 0xfffff;
    if (MVar2 == MPP_FMT_YUV420SP) {
      sVar4 = fread(buf + local_64,1,(ulong)(uVar5 * uVar1 * 3 >> 1),(FILE *)fp);
      if ((uint)sVar4 != uVar5 * uVar1 * 3 >> 1) {
        _mpp_log_l(2,"utils","read 420sp fbc file payload failed %d vs %d\n","read_image",
                   sVar4 & 0xffffffff,uVar5 * uVar1 * 3 >> 1);
        return MPP_NOK;
      }
    }
    else if ((MVar2 == MPP_FMT_YUV422SP) || (MVar2 - MPP_FMT_YUV422_YUYV < 4)) {
      sVar4 = fread(buf + local_64,1,(ulong)(uVar5 * uVar1 * 2),(FILE *)fp);
      if ((int)sVar4 != uVar5 * uVar1 * 2) {
        _mpp_log_l(2,"utils","read 422sp fbc file payload failed %d vs %d\n","read_image",
                   sVar4 & 0xffffffff,uVar5 * uVar1 * 2);
        return MPP_NOK;
      }
    }
    else {
      _mpp_log_l(2,"utils","not supported fbc format %x\n","read_image",fmt);
    }
    return MPP_OK;
  }
  MVar2 = fmt & 0xfffff;
  if (MVar2 == MPP_FMT_YUV420SP) {
LAB_00106c0b:
    for (buf_y._4_4_ = 0; buf_y._4_4_ < height; buf_y._4_4_ = buf_y._4_4_ + 1) {
      sVar4 = fread(buf + buf_y._4_4_ * hor_stride,1,(ulong)width,(FILE *)fp);
      if ((RK_U32)sVar4 != width) {
        return MPP_NOK;
      }
    }
    uVar1 = width + 1 & 0xfffffffe;
    for (buf_y._4_4_ = 0; buf_y._4_4_ < height + 1 >> 1; buf_y._4_4_ = buf_y._4_4_ + 1) {
      sVar4 = fread(buf + (ulong)(buf_y._4_4_ * hor_stride) + (ulong)uVar5,1,(ulong)uVar1,(FILE *)fp
                   );
      if ((uint)sVar4 != uVar1) {
        return MPP_NOK;
      }
    }
  }
  else {
    if (MVar2 != MPP_FMT_YUV422SP) {
      if (MVar2 == MPP_FMT_YUV420P) {
        for (buf_y._4_4_ = 0; buf_y._4_4_ < height; buf_y._4_4_ = buf_y._4_4_ + 1) {
          sVar4 = fread(buf + buf_y._4_4_ * hor_stride,1,(ulong)width,(FILE *)fp);
          if ((RK_U32)sVar4 != width) {
            return MPP_NOK;
          }
        }
        uVar1 = width + 1;
        for (buf_y._4_4_ = 0; buf_y._4_4_ < height + 1 >> 1; buf_y._4_4_ = buf_y._4_4_ + 1) {
          sVar4 = fread(buf + (ulong)(buf_y._4_4_ * hor_stride >> 1) + (ulong)uVar5,1,
                        (ulong)(uVar1 >> 1),(FILE *)fp);
          if ((uint)sVar4 != uVar1 >> 1) {
            return MPP_NOK;
          }
        }
        buf_y._4_4_ = 0;
        while( true ) {
          if (height + 1 >> 1 <= buf_y._4_4_) {
            return MPP_OK;
          }
          sVar4 = fread(buf + (ulong)(buf_y._4_4_ * hor_stride >> 1) +
                              (ulong)(hor_stride * ver_stride >> 2) + (ulong)uVar5,1,
                        (ulong)(uVar1 >> 1),(FILE *)fp);
          if ((uint)sVar4 != uVar1 >> 1) break;
          buf_y._4_4_ = buf_y._4_4_ + 1;
        }
        return MPP_NOK;
      }
      if (MVar2 == MPP_FMT_YUV420SP_VU) goto LAB_00106c0b;
      if (5 < MVar2 - MPP_FMT_YUV422P) {
        if (MVar2 == MPP_FMT_YUV400) {
          MVar3 = read_with_pixel_width(buf,width,height,hor_stride,1,fp);
          return MVar3;
        }
        if (MVar2 - MPP_FMT_YUV444SP < 2) {
LAB_00106e64:
          MVar3 = read_with_pixel_width(buf,width,height,hor_stride,3,fp);
          return MVar3;
        }
        if (5 < MVar2 - MPP_FMT_RGB565) {
          if (1 < MVar2 - MPP_FMT_RGB888) {
            if (5 < MVar2 - MPP_FMT_RGB101010) {
              _mpp_log_l(2,"utils","read image do not support fmt %d\n","read_image",fmt);
              return MPP_ERR_VALUE;
            }
            MVar3 = read_with_pixel_width(buf,width,height,hor_stride,4,fp);
            return MVar3;
          }
          goto LAB_00106e64;
        }
      }
    }
    row = read_with_pixel_width(buf,width,height,hor_stride,2,fp);
  }
  return row;
}

Assistant:

MPP_RET read_image(RK_U8 *buf, FILE *fp, RK_U32 width, RK_U32 height,
                   RK_U32 hor_stride, RK_U32 ver_stride, MppFrameFormat fmt)
{
    MPP_RET ret = MPP_OK;
    RK_U32 read_size;
    RK_U32 row = 0;
    RK_U8 *buf_y = buf;
    RK_U8 *buf_u = buf_y + hor_stride * ver_stride; // NOTE: diff from gen_yuv_image
    RK_U8 *buf_v = buf_u + hor_stride * ver_stride / 4; // NOTE: diff from gen_yuv_image

    if (MPP_FRAME_FMT_IS_FBC(fmt)) {
        RK_U32 align_w = MPP_ALIGN(width, 16);
        RK_U32 align_h = MPP_ALIGN(height, 16);
        RK_U32 header_size = 0;

        if ((fmt & MPP_FRAME_FBC_MASK) == MPP_FRAME_FBC_AFBC_V1)
            header_size = MPP_ALIGN(align_w * align_h / 16, SZ_4K);
        else
            header_size = align_w * align_h / 16;

        /* read fbc header first */
        read_size = fread(buf, 1, header_size, fp);
        if (read_size != header_size) {
            mpp_err_f("read fbc file header failed %d vs %d\n",
                      read_size, header_size);
            ret  = MPP_NOK;
            goto err;
        }
        buf += header_size;

        switch (fmt & MPP_FRAME_FMT_MASK) {
        case MPP_FMT_YUV420SP : {
            read_size = fread(buf, 1, align_w * align_h * 3 / 2, fp);
            if (read_size != align_w * align_h * 3 / 2) {
                mpp_err_f("read 420sp fbc file payload failed %d vs %d\n",
                          read_size, align_w * align_h * 3 / 2);
                ret  = MPP_NOK;
                goto err;
            }
        } break;
        case MPP_FMT_YUV422SP :
        case MPP_FMT_YUV422_YUYV :
        case MPP_FMT_YUV422_YVYU :
        case MPP_FMT_YUV422_UYVY :
        case MPP_FMT_YUV422_VYUY : {
            read_size = fread(buf, 1, align_w * align_h * 2, fp);
            if (read_size != align_w * align_h * 2) {
                mpp_err_f("read 422sp fbc file payload failed %d vs %d\n",
                          read_size, align_w * align_h * 2);
                ret  = MPP_NOK;
                goto err;
            }
        } break;
        default : {
            mpp_err_f("not supported fbc format %x\n", fmt);
        } break;
        }

        return MPP_OK;
    }

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP_VU:
    case MPP_FMT_YUV420SP : {
        for (row = 0; row < height; row++) {
            read_size = fread(buf_y + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        height = MPP_ALIGN(height, 2);
        width = MPP_ALIGN(width, 2);
        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_u + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }
    } break;
    case MPP_FMT_YUV420P : {
        for (row = 0; row < height; row++) {
            read_size = fread(buf_y + row * hor_stride, 1, width, fp);
            if (read_size != width) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        width = MPP_ALIGN(width, 2);
        height = MPP_ALIGN(height, 2);
        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_u + row * hor_stride / 2, 1, width / 2, fp);
            if (read_size != width / 2) {
                ret  = MPP_NOK;
                goto err;
            }
        }

        for (row = 0; row < height / 2; row++) {
            read_size = fread(buf_v + row * hor_stride / 2, 1, width / 2, fp);
            if (read_size != width / 2) {
                ret  = MPP_NOK;
                goto err;
            }
        }
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 4, fp);
    } break;
    case MPP_FMT_YUV422P :
    case MPP_FMT_YUV422SP :
    case MPP_FMT_YUV422SP_VU:
    case MPP_FMT_BGR444 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 2, fp);
    } break;
    case MPP_FMT_YUV444SP :
    case MPP_FMT_YUV444P :
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 3, fp);
    } break;
    case MPP_FMT_YUV400 : {
        ret = read_with_pixel_width(buf_y, width, height, hor_stride, 1, fp);
    } break;
    default : {
        mpp_err_f("read image do not support fmt %d\n", fmt);
        ret = MPP_ERR_VALUE;
    } break;
    }

err:

    return ret;
}